

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

TimerId __thiscall
mario::TimerQueue::addTimer(TimerQueue *this,TimerCallback *cb,Timestamp when,double interval)

{
  EventLoop *this_00;
  Timer *pTVar1;
  int64_t seq;
  TimerQueue *local_b0;
  code *local_a8;
  undefined8 local_a0;
  type local_98;
  Functor local_78;
  TimerQueue *local_48;
  Timer *local_40;
  Timer *timer;
  double interval_local;
  TimerCallback *cb_local;
  TimerQueue *this_local;
  Timestamp when_local;
  
  timer = (Timer *)interval;
  interval_local = (double)cb;
  cb_local = (TimerCallback *)this;
  this_local = (TimerQueue *)when._microSecondsSinceEpoch;
  pTVar1 = (Timer *)operator_new(0x40);
  local_48 = this_local;
  Timer::Timer(pTVar1,(TimerCallback *)interval_local,(Timestamp)this_local,(double)timer);
  this_00 = this->_loop;
  local_a8 = addTimerInLoop;
  local_a0 = 0;
  local_b0 = this;
  local_40 = pTVar1;
  std::bind<void(mario::TimerQueue::*)(mario::Timer*),mario::TimerQueue*,mario::Timer*&>
            (&local_98,(offset_in_TimerQueue_to_subr *)&local_a8,&local_b0,&local_40);
  std::function<void()>::
  function<std::_Bind<void(mario::TimerQueue::*(mario::TimerQueue*,mario::Timer*))(mario::Timer*)>,void>
            ((function<void()> *)&local_78,&local_98);
  EventLoop::runInLoop(this_00,&local_78);
  std::function<void_()>::~function(&local_78);
  pTVar1 = local_40;
  seq = Timer::sequence(local_40);
  TimerId::TimerId((TimerId *)&when_local,pTVar1,seq);
  return _when_local;
}

Assistant:

TimerId TimerQueue::addTimer(const TimerCallback& cb, Timestamp when, double interval) {
    Timer* timer = new Timer(cb, when, interval);
    _loop->runInLoop(
            std::bind(&TimerQueue::addTimerInLoop, this, timer)
            );

    return TimerId(timer, timer->sequence());
}